

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O2

EStatusCode __thiscall
Type1ToType2Converter::Type1VMoveto(Type1ToType2Converter *this,LongList *inOperandList)

{
  EStatusCode EVar1;
  Trace *this_00;
  
  if ((inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size == 0) {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "Type1ToType2Converter::Type1VMoveto, vmoveto expecting 1 argument, got %d. aborting."
                      ,(inOperandList->super__List_base<long,_std::allocator<long>_>)._M_impl.
                       _M_node._M_size);
    EVar1 = eFailure;
  }
  else {
    this->mFirstPathConstructionEncountered = true;
    RecordOperatorWithParameters(this,4,inOperandList);
    EVar1 = eSuccess;
  }
  return EVar1;
}

Assistant:

EStatusCode Type1ToType2Converter::Type1VMoveto(const LongList& inOperandList)
{
	if(inOperandList.size() < 1) {
		TRACE_LOG1("Type1ToType2Converter::Type1VMoveto, vmoveto expecting 1 argument, got %d. aborting.", inOperandList.size());
		return eFailure;
	}

	mFirstPathConstructionEncountered = true;
	return RecordOperatorWithParameters(4,inOperandList);
}